

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameSpecsOf.hpp
# Opt level: O3

string * __thiscall
sciplot::FrameSpecsOf<sciplot::LegendSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,FrameSpecsOf<sciplot::LegendSpecs> *this)

{
  stringstream ss;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  if (this->m_show == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"nobox","");
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"box ",4);
    LineSpecsOf<sciplot::LineSpecs>::repr_abi_cxx11_
              (&local_1e0,&(this->m_line_specs).super_LineSpecsOf<sciplot::LineSpecs>);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    internal::removeExtraWhitespaces(__return_storage_ptr__,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

auto FrameSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    if(m_show == false)
        return "nobox";

    std::stringstream ss;
    ss << "box " << m_line_specs.repr();
    return internal::removeExtraWhitespaces(ss.str());
}